

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall bidirectional::BiDirectional::initContainers(BiDirectional *this)

{
  pointer pPVar1;
  BiDirectional *in_RDI;
  Search *search_ptr;
  undefined8 in_stack_fffffffffffffff0;
  Directions direction;
  
  direction = (Directions)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  pPVar1 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
           operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                       *)0x24571b);
  if (pPVar1->direction == BOTH) {
    std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::operator->
              ((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_> *)
               0x245759);
    Search::makeHeap((Search *)this);
    std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::operator->
              ((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_> *)
               0x245771);
    Search::makeHeap((Search *)this);
  }
  else {
    std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::operator->
              ((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_> *)
               0x24572d);
    getSearchPtr(in_RDI,direction);
    Search::makeHeap((Search *)this);
  }
  return;
}

Assistant:

void BiDirectional::initContainers() {
  if (params_ptr_->direction != BOTH) {
    Search* search_ptr = getSearchPtr(params_ptr_->direction);
    search_ptr->makeHeap();
  } else {
    fwd_search_ptr_->makeHeap();
    bwd_search_ptr_->makeHeap();
  }
}